

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

HierarchicalInstanceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::PortConnectionSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,InstanceNameSyntax **args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *args_2,Token *args_3)

{
  Token openParen;
  Token closeParen;
  HierarchicalInstanceSyntax *this_00;
  
  this_00 = (HierarchicalInstanceSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((HierarchicalInstanceSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (HierarchicalInstanceSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  openParen.kind = args_1->kind;
  openParen._2_1_ = args_1->field_0x2;
  openParen.numFlags.raw = (args_1->numFlags).raw;
  openParen.rawLen = args_1->rawLen;
  openParen.info = args_1->info;
  closeParen.kind = args_3->kind;
  closeParen._2_1_ = args_3->field_0x2;
  closeParen.numFlags.raw = (args_3->numFlags).raw;
  closeParen.rawLen = args_3->rawLen;
  closeParen.info = args_3->info;
  slang::syntax::HierarchicalInstanceSyntax::HierarchicalInstanceSyntax
            (this_00,*args,openParen,args_2,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }